

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

QpVector * __thiscall MatrixBase::extractcol(MatrixBase *this,HighsInt col,QpVector *target)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  if (0 < target->num_nz) {
    piVar3 = (target->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      pdVar4[piVar3[lVar10]] = 0.0;
      piVar3[lVar10] = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 < target->num_nz);
  }
  target->num_nz = 0;
  if (col < this->num_col) {
    piVar3 = (this->start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = piVar3[col];
    uVar11 = (ulong)uVar1;
    uVar8 = piVar3[(long)col + 1] - uVar1;
    uVar9 = (ulong)uVar8;
    if (uVar8 != 0 && (int)uVar1 <= piVar3[(long)col + 1]) {
      piVar5 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (target->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        iVar2 = piVar5[(int)uVar11 + (int)lVar10];
        piVar6[lVar10] = iVar2;
        pdVar7[iVar2] = pdVar4[piVar3[col] + (int)lVar10];
        lVar10 = lVar10 + 1;
        uVar11 = (ulong)piVar3[col];
        uVar9 = (long)piVar3[(long)col + 1] - uVar11;
      } while (lVar10 < (long)uVar9);
    }
  }
  else {
    *(target->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = col - this->num_col;
    (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[(long)col - (long)this->num_col] = 1.0;
    uVar9 = 1;
  }
  target->num_nz = (HighsInt)uVar9;
  return target;
}

Assistant:

QpVector& extractcol(HighsInt col, QpVector& target) const {
    assert(target.dim == num_row);
    target.reset();

    if (col >= num_col) {
      target.index[0] = col - num_col;
      target.value[col - num_col] = 1.0;
      target.num_nz = 1;
    } else {
      for (HighsInt i = 0; i < start[col + 1] - start[col]; i++) {
        target.index[i] = index[start[col] + i];
        target.value[target.index[i]] = value[start[col] + i];
      }
      target.num_nz = start[col + 1] - start[col];
    }

    return target;
  }